

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_vers_test(void)

{
  pointer *m;
  pointer puVar1;
  unsigned_long uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  unsigned_long *puVar8;
  matras_id_t id;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  matras_view *v;
  undefined8 uVar12;
  uint uVar13;
  matras_stats *pmVar14;
  long lVar15;
  undefined1 local_168 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> comps [8];
  matras local;
  matras_id_t tmp;
  int local_34;
  
  local_34 = 1;
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n");
  memset(local_168,0,0xc0);
  extents_in_use = 0;
  matras_create((matras *)
                &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,8,&ver_allocator,(matras_stats *)0x0);
  iVar6 = 10;
  _tmp = 0;
  uVar13 = 1;
  do {
    if (7999 < iVar6) {
      matras_destroy((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      _ok((uint)(extents_in_use == 0),"extents_in_use == 0",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0xff,
          "line %d",0xff);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_vers_test");
      check_plan();
      lVar15 = 0xa8;
      do {
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                   ((long)comps + lVar15 + -8));
        lVar15 = lVar15 + -0x18;
      } while (lVar15 != -0x18);
      return;
    }
    for (iVar5 = 0; iVar5 != 800; iVar5 = iVar5 + 1) {
      uVar3 = rand();
      if ((uVar3 & 0xf) == 0) {
        if ((local_34 == 1) || ((local_34 != 8 && (uVar3 = rand(), (uVar3 & 1) == 0)))) {
          uVar3 = 0;
          if (~vermask != 0) {
            for (; ((uint)~vermask >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          vermask = vermask | 1 << (uVar3 & 0x1f);
          matras_create_read_view
                    ((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (matras_view *)((long)&views[0].root + (ulong)(uVar3 << 5)));
          if ((ulong)uVar3 == 0) {
            pcVar9 = "new_ver > 0";
            uVar12 = 0xcf;
LAB_00103fa7:
            fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar9,"false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc"
                    ,uVar12,"matras_vers_test");
            exit(-1);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &comps[(ulong)uVar3 - 1].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168);
          local_34 = local_34 + 1;
          uVar13 = uVar13 | 1 << ((byte)uVar3 & 0x1f);
        }
        else {
          do {
            iVar4 = rand();
            uVar3 = iVar4 % 7 + 1;
          } while ((uVar13 >> (uVar3 & 0x1f) & 1) == 0);
          matras_destroy_read_view
                    ((matras *)
                     &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,views + (int)uVar3);
          uVar10 = ~(1 << ((byte)uVar3 & 0x1f));
          vermask = vermask & uVar10;
          puVar1 = comps[(long)(int)uVar3 + -1].
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          if (comps[(int)uVar3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != puVar1) {
            comps[(int)uVar3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start = puVar1;
          }
          local_34 = local_34 + -1;
          uVar13 = uVar13 & uVar10;
        }
      }
      else {
        uVar3 = rand();
        if (((uVar3 & 7) == 0) &&
           ((undefined1  [8])
            comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != local_168)) {
          matras_dealloc((matras *)
                         &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               comps[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
        }
        iVar4 = rand();
        id = iVar4 % iVar6;
        pmVar14 = (matras_stats *)(_tmp * 10000);
        while ((ulong)((long)comps[0].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start - (long)local_168 >> 3) <=
               (ulong)(long)(int)id) {
          local.stats = pmVar14;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_168,
                     (unsigned_long *)&local.stats);
          plVar7 = (long *)matras_alloc((matras *)
                                        &comps[7].
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        (matras_id_t *)&local.stats);
          *plVar7 = (long)pmVar14;
          pmVar14 = (matras_stats *)((long)&pmVar14->extent_count + 1);
        }
        _tmp = _tmp + 1;
        *(unsigned_long *)((long)local_168 + (long)(int)id * 8) = _tmp;
        m = &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        matras_touch((matras *)m,id);
        puVar8 = (unsigned_long *)matras_get((matras *)m,id);
        *puVar8 = _tmp;
      }
      views[0].prev_view = (matras_view *)local.head.block_count;
      views[0].next_view = local.head.prev_view;
      views[0].root =
           comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      views[0].block_count = (size_t)local.head.root;
      for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
        if ((uVar13 >> ((uint)lVar15 & 0x1f) & 1) != 0) {
          if ((long)comps[lVar15].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start -
              (long)comps[lVar15 + -1].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage >> 3 != views[lVar15].block_count) {
            pcVar9 = "comps[i].size() == views[i].block_count";
            uVar12 = 0xf5;
            goto LAB_00103fa7;
          }
          uVar11 = 0;
          while( true ) {
            puVar1 = comps[lVar15 + -1].
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if ((ulong)((long)comps[lVar15].
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)puVar1 >> 3) <=
                uVar11) break;
            v = (matras_view *)
                &comps[7].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            if (views[lVar15].next_view != (matras_view *)0x0) {
              v = views + lVar15;
            }
            uVar2 = puVar1[uVar11];
            puVar8 = (unsigned_long *)
                     matras_view_get_no_check
                               ((matras *)
                                &comps[7].
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,v,
                                (matras_id_t)uVar11);
            uVar11 = uVar11 + 1;
            if (uVar2 != *puVar8) {
              pcVar9 = "val1 == val2";
              uVar12 = 0xf9;
              goto LAB_00103fa7;
            }
          }
        }
      }
    }
    iVar6 = (int)((double)iVar6 * 1.5);
  } while( true );
}

Assistant:

void
matras_vers_test()
{
	plan(1);
	header();

	std::vector<type_t> comps[MATRAS_VERSION_COUNT];
	int use_mask = 1;
	int cur_num_or_ver = 1;
	struct matras local;
	extents_in_use = 0;
	matras_create(&local, sizeof(type_t), &ver_allocator, NULL);
	type_t val = 0;
	for (int s = 10; s < 8000; s = int(s * 1.5)) {
		for (int k = 0; k < 800; k++) {
			if (rand() % 16 == 0) {
				bool add_ver;
				if (cur_num_or_ver == 1)
					add_ver = true;
				else if (cur_num_or_ver == MATRAS_VERSION_COUNT)
					add_ver = false;
				else
					add_ver = rand() % 2 == 0;
				if (add_ver) {
					cur_num_or_ver++;
					matras_id_t new_ver = reg_view_id();
					matras_create_read_view(&local, views + new_ver);
					fail_unless(new_ver > 0);
					use_mask |= (1 << new_ver);
					comps[new_ver] = comps[0];
				} else {
					cur_num_or_ver--;
					int del_ver;
					do {
						del_ver = 1 + rand() % (MATRAS_VERSION_COUNT - 1);
					} while ((use_mask & (1 << del_ver)) == 0);
					matras_destroy_read_view(&local, views + del_ver);
					unreg_view_id(del_ver);
					comps[del_ver].clear();
					use_mask &= ~(1 << del_ver);
				}
			} else {
				if (rand() % 8 == 0 && comps[0].size() > 0) {
					matras_dealloc(&local);
					comps[0].pop_back();
				}
				size_t p = rand() % s;
				type_t mod = 0;
				while (p >= comps[0].size()) {
					comps[0].push_back(val * 10000 + mod);
					matras_id_t tmp;
					type_t *ptrval = (type_t *)matras_alloc(&local, &tmp);
					*ptrval = val * 10000 + mod;
					mod++;
				}
				val++;
				comps[0][p] = val;
				matras_touch(&local, p);
				*(type_t *)matras_get(&local, p) = val;
			}
			views[0] = local.head;

			for (int i = 0; i < MATRAS_VERSION_COUNT; i++) {
				if ((use_mask & (1 << i)) == 0)
					continue;
				fail_unless(comps[i].size() == views[i].block_count);
				for (size_t j = 0; j < comps[i].size(); j++) {
					type_t val1 = comps[i][j];
					type_t val2 = *(type_t *)matras_view_get(&local, views + i, j);
					fail_unless(val1 == val2);
				}
			}
		}
	}
	matras_destroy(&local);
	ok(extents_in_use == 0);

	footer();
	check_plan();
}